

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_swap(Forth *this)

{
  double Value;
  double x;
  int n;
  Forth *this_local;
  
  requireFStackDepth(this,2,"SWAP");
  Value = ForthStack<double>::getTop(&this->fStack,1);
  ForthStack<double>::moveStack(&this->fStack,1,0,1);
  ForthStack<double>::setTop(&this->fStack,Value);
  return;
}

Assistant:

void f_swap() {
			REQUIRE_FSTACK_DEPTH(2, "SWAP");
			auto n = 1;
			if (n > 0) {
				auto x = fStack.getTop(n);
				fStack.moveStack(n, n - 1, n);
				fStack.setTop(x);
			}
		}